

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

Var __thiscall
Js::TypedArray<unsigned_char,_false,_false>::Subarray
          (TypedArray<unsigned_char,_false,_false> *this,uint32 begin,uint32 end)

{
  Type TVar1;
  int iVar2;
  ArrayBufferBase *pAVar3;
  ScriptContext *scriptContext;
  code *pcVar4;
  anon_class_40_5_98b124e0_for_newObjectCreationFunction newObjectCreationFunction;
  bool bVar5;
  undefined4 *puVar6;
  JavascriptFunction *defaultConstructor;
  JavascriptFunction *instanceObj;
  Var aValue;
  RecyclableObject *pRVar7;
  undefined4 uStack_5c;
  undefined4 uStack_4c;
  
  if (end < begin) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x53d,"(end >= begin)","end >= begin");
    if (!bVar5) goto LAB_00c0e598;
    *puVar6 = 0;
  }
  pAVar3 = (this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr;
  scriptContext =
       (((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
           super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  TVar1 = (this->super_TypedArrayBase).byteOffset;
  iVar2 = (this->super_TypedArrayBase).BYTES_PER_ELEMENT;
  defaultConstructor = TypedArrayBase::GetDefaultConstructor(this,scriptContext);
  instanceObj = (JavascriptFunction *)
                JavascriptOperators::SpeciesConstructor
                          ((RecyclableObject *)this,defaultConstructor,scriptContext);
  bVar5 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x548,"(JavascriptOperators::IsConstructor(constructor))",
                                "JavascriptOperators::IsConstructor(constructor)");
    if (!bVar5) {
LAB_00c0e598:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  newObjectCreationFunction._36_4_ = uStack_4c;
  newObjectCreationFunction.newLength = end - begin;
  newObjectCreationFunction._20_4_ = uStack_5c;
  newObjectCreationFunction.beginByteOffset = iVar2 * begin + TVar1;
  newObjectCreationFunction.buffer = pAVar3;
  newObjectCreationFunction.constructor = (RecyclableObject *)instanceObj;
  newObjectCreationFunction.scriptContext = scriptContext;
  aValue = JavascriptOperators::
           NewObjectCreationHelper_ReentrancySafe<Js::TypedArray<unsigned_char,false,false>::Subarray(unsigned_int,unsigned_int)::_lambda()_1_>
                     ((RecyclableObject *)instanceObj,instanceObj == defaultConstructor,
                      scriptContext->threadContext,newObjectCreationFunction);
  pRVar7 = VarTo<Js::RecyclableObject>(aValue);
  return pRVar7;
}

Assistant:

Var TypedArray<TypeName, clamped, virtualAllocated>::Subarray(uint32 begin, uint32 end)
    {
        Assert(end >= begin);

        Var newTypedArray;
        ScriptContext* scriptContext = this->GetScriptContext();
        ArrayBufferBase* buffer = this->GetArrayBuffer();
        uint32 srcByteOffset = this->GetByteOffset();
        uint32 beginByteOffset = srcByteOffset + begin * BYTES_PER_ELEMENT;
        uint32 newLength = end - begin;

        JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(this, scriptContext);
        RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(this, defaultConstructor, scriptContext);
        AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

        bool isDefaultConstructor = constructor == defaultConstructor;
        newTypedArray = VarTo<RecyclableObject>(JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
        {
            Js::Var constructorArgs[] = { constructor, buffer, JavascriptNumber::ToVar(beginByteOffset, scriptContext), JavascriptNumber::ToVar(newLength, scriptContext) };
            Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
            return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), newLength, scriptContext);
        }));

        return newTypedArray;
    }